

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O1

Io_MvMod_t * Io_MvModAlloc(void)

{
  Io_MvMod_t *__s;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  
  __s = (Io_MvMod_t *)malloc(0x88);
  memset(__s,0,0x88);
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vInputs = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vOutputs = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vLatches = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vFlops = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vResets = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vNames = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vSubckts = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vShorts = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vOnehots = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vMvs = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vConstrs = pVVar1;
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 0x200;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(0x1000);
  pVVar1->pArray = ppvVar2;
  __s->vLtlProperties = pVVar1;
  return __s;
}

Assistant:

static Io_MvMod_t * Io_MvModAlloc()
{
    Io_MvMod_t * p;
    p = ABC_ALLOC( Io_MvMod_t, 1 );
    memset( p, 0, sizeof(Io_MvMod_t) );
    p->vInputs  = Vec_PtrAlloc( 512 );
    p->vOutputs = Vec_PtrAlloc( 512 );
    p->vLatches = Vec_PtrAlloc( 512 );
    p->vFlops   = Vec_PtrAlloc( 512 );
    p->vResets  = Vec_PtrAlloc( 512 );
    p->vNames   = Vec_PtrAlloc( 512 );
    p->vSubckts = Vec_PtrAlloc( 512 );
    p->vShorts  = Vec_PtrAlloc( 512 );
    p->vOnehots = Vec_PtrAlloc( 512 );
    p->vMvs     = Vec_PtrAlloc( 512 );
    p->vConstrs = Vec_PtrAlloc( 512 );
    p->vLtlProperties = Vec_PtrAlloc( 512 );
    return p;
}